

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O1

void __thiscall
cmTestGenerator::GenerateOldStyle(cmTestGenerator *this,ostream *fout,Indent *indent)

{
  pointer pbVar1;
  pointer pcVar2;
  cmTest *pcVar3;
  char cVar4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  int iVar7;
  _Rb_tree_header *p_Var8;
  char *pcVar9;
  pointer pbVar10;
  string exe;
  string local_b0;
  allocator local_89;
  Indent *local_88;
  cmTestGenerator *local_80;
  cmTest *local_78;
  string local_70;
  string local_50;
  
  this->TestGenerated = true;
  local_78 = this->Test;
  pbVar10 = (local_78->Command).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar2 = (pbVar10->_M_dataplus)._M_p;
  local_88 = indent;
  local_80 = this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + pbVar10->_M_string_length);
  cmsys::SystemTools::ConvertToUnixSlashes(&local_70);
  if (0 < local_88->Level) {
    iVar7 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(fout," ",1);
      iVar7 = iVar7 + 1;
    } while (iVar7 < local_88->Level);
  }
  std::__ostream_insert<char,std::char_traits<char>>(fout,"add_test(",9);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  pcVar2 = (local_80->Test->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar2,pcVar2 + (local_80->Test->Name)._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (fout,local_b0._M_dataplus._M_p,local_b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," \"",2);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  pbVar10 = (local_78->Command).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  while (pbVar1 = pbVar10 + 1,
        pbVar1 != (local_78->Command).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>(fout," \"",2);
    if (pbVar10[1]._M_string_length != 0) {
      pcVar9 = (pbVar1->_M_dataplus)._M_p;
      do {
        if (*pcVar9 == '\"') {
          local_b0._M_dataplus._M_p._0_1_ = 0x5c;
          std::__ostream_insert<char,std::char_traits<char>>(fout,(char *)&local_b0,1);
        }
        local_b0._M_dataplus._M_p._0_1_ = *pcVar9;
        std::__ostream_insert<char,std::char_traits<char>>(fout,(char *)&local_b0,1);
        pcVar9 = pcVar9 + 1;
      } while (pcVar9 != pbVar10[1]._M_dataplus._M_p + pbVar10[1]._M_string_length);
    }
    std::__ostream_insert<char,std::char_traits<char>>(fout,"\"",1);
    pbVar10 = pbVar1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(fout,")",1);
  cVar4 = (char)fout;
  std::ios::widen((char)fout->_vptr_basic_ostream[-3] + cVar4);
  std::ostream::put(cVar4);
  std::ostream::flush();
  pcVar3 = local_80->Test;
  if ((pcVar3->Properties).
      super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
      ._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    if (0 < local_88->Level) {
      iVar7 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(fout," ",1);
        iVar7 = iVar7 + 1;
      } while (iVar7 < local_88->Level);
    }
    std::__ostream_insert<char,std::char_traits<char>>(fout,"set_tests_properties(",0x15);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    pcVar2 = (local_80->Test->Name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar2,pcVar2 + (local_80->Test->Name)._M_string_length);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (fout,local_b0._M_dataplus._M_p,local_b0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," PROPERTIES ",0xc);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    p_Var6 = (pcVar3->Properties).
             super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
             ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var8 = &(pcVar3->Properties).
              super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
              ._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var6 != p_Var8) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(fout," ",1);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (fout,*(char **)(p_Var6 + 1),(long)p_Var6[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        pcVar9 = cmProperty::GetValue((cmProperty *)(p_Var6 + 2));
        std::__cxx11::string::string((string *)&local_50,pcVar9,&local_89);
        cmOutputConverter::EscapeForCMake(&local_b0,&local_50);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,local_b0._M_dataplus._M_p,local_b0._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      } while ((_Rb_tree_header *)p_Var6 != p_Var8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(fout,")",1);
    std::ios::widen((char)fout->_vptr_basic_ostream[-3] + cVar4);
    std::ostream::put(cVar4);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmTestGenerator::GenerateOldStyle(std::ostream& fout,
                                       Indent const& indent)
{
  this->TestGenerated = true;

  // Get the test command line to be executed.
  std::vector<std::string> const& command = this->Test->GetCommand();

  std::string exe = command[0];
  cmSystemTools::ConvertToUnixSlashes(exe);
  fout << indent;
  fout << "add_test(";
  fout << this->Test->GetName() << " \"" << exe << "\"";

  for(std::vector<std::string>::const_iterator argit = command.begin()+1;
      argit != command.end(); ++argit)
    {
    // Just double-quote all arguments so they are re-parsed
    // correctly by the test system.
    fout << " \"";
    for(std::string::const_iterator c = argit->begin();
        c != argit->end(); ++c)
      {
      // Escape quotes within arguments.  We should escape
      // backslashes too but we cannot because it makes the result
      // inconsistent with previous behavior of this command.
      if((*c == '"'))
        {
        fout << '\\';
        }
      fout << *c;
      }
    fout << "\"";
    }
  fout << ")" << std::endl;

  // Output properties for the test.
  cmPropertyMap& pm = this->Test->GetProperties();
  if(!pm.empty())
    {
    fout << indent << "set_tests_properties(" << this->Test->GetName()
         << " PROPERTIES ";
    for(cmPropertyMap::const_iterator i = pm.begin();
        i != pm.end(); ++i)
      {
      fout << " " << i->first
           << " " << cmOutputConverter::EscapeForCMake(i->second.GetValue());
      }
    fout << ")" << std::endl;
    }
}